

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extractLaneI32x4(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  LaneArray<4> local_80;
  
  getLanes<int,4>(&local_80,(wasm *)this,
                  (Literal *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,index)));
  other = std::array<wasm::Literal,_4UL>::at(&local_80,(ulong)CONCAT31(in_register_00000011,index));
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_4UL>::~array(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneI32x4(uint8_t index) const {
  return getLanesI32x4().at(index);
}